

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int GetRawExpressScanDataResponseRPLIDAR
              (RPLIDAR *pRPLIDAR,uchar *esdataresponse,int nb_bytes_response)

{
  int iVar1;
  double dVar2;
  int local_494;
  undefined1 local_490 [8];
  CHRONO chrono;
  uchar *ptr;
  int local_438;
  int nbBytesDiscarded;
  int nbBytesToRequest;
  int res;
  int recvbuflen;
  int BytesReceived;
  uchar recvbuf [1024];
  int nb_bytes_response_local;
  uchar *esdataresponse_local;
  RPLIDAR *pRPLIDAR_local;
  
  res = 0;
  nbBytesToRequest = 0;
  nbBytesDiscarded = 1;
  local_438 = 0;
  ptr._4_4_ = 0;
  chrono.Suspended = 0;
  chrono._68_4_ = 0;
  recvbuf._1020_4_ = nb_bytes_response;
  StartChrono((CHRONO *)local_490);
  memset(&recvbuflen,0,0x400);
  nbBytesToRequest = 0x3ff;
  res = 0;
  local_438._0_1_ = recvbuf[0x3fc];
  local_438._1_1_ = recvbuf[0x3fd];
  local_438._2_1_ = recvbuf[0x3fe];
  local_438._3_1_ = recvbuf[0x3ff];
  iVar1 = ReadAllRS232Port(&pRPLIDAR->RS232Port,(uint8 *)&recvbuflen,recvbuf._1020_4_);
  if (iVar1 == 0) {
    res = local_438 + res;
    do {
      nbBytesDiscarded =
           FindExpressScanDataResponseRPLIDAR
                     ((uchar *)&recvbuflen,res,recvbuf._1020_4_,&local_438,
                      (uchar **)&chrono.Suspended,(int *)((long)&ptr + 4));
      if (nbBytesDiscarded == 0) {
        if (0 < (res - ptr._4_4_) - recvbuf._1020_4_) {
          printf("Warning getting data from a RPLIDAR : Unexpected data after a data response. \n");
        }
        memcpy(esdataresponse,&recvbuflen,(long)(int)recvbuf._1020_4_);
        return 0;
      }
      if (nbBytesDiscarded == 1) {
        if ((int)recvbuf._1020_4_ < ptr._4_4_) {
          local_494._0_1_ = recvbuf[0x3fc];
          local_494._1_1_ = recvbuf[0x3fd];
          local_494._2_1_ = recvbuf[0x3fe];
          local_494._3_1_ = recvbuf[0x3ff];
        }
        else {
          local_494 = ptr._4_4_;
        }
        local_438 = local_494;
      }
      memmove(&recvbuflen,(void *)((long)&recvbuflen + (long)ptr._4_4_),(long)(res - ptr._4_4_));
      res = res - ptr._4_4_;
      if (nbBytesToRequest < res + local_438) {
        printf("Error reading data from a RPLIDAR : Invalid data. \n");
        return 4;
      }
      iVar1 = ReadAllRS232Port(&pRPLIDAR->RS232Port,(uint8 *)((long)&recvbuflen + (long)res),
                               local_438);
      if (iVar1 != 0) {
        printf("Error reading data from a RPLIDAR. \n");
        return 1;
      }
      res = local_438 + res;
      dVar2 = GetTimeElapsedChronoQuick((CHRONO *)local_490);
    } while (dVar2 <= 4.0);
    printf("Error reading data from a RPLIDAR : Data response timeout. \n");
    pRPLIDAR_local._4_4_ = 2;
  }
  else {
    printf("Error reading data from a RPLIDAR. \n");
    pRPLIDAR_local._4_4_ = 1;
  }
  return pRPLIDAR_local._4_4_;
}

Assistant:

inline int GetRawExpressScanDataResponseRPLIDAR(RPLIDAR* pRPLIDAR, unsigned char* esdataresponse, int nb_bytes_response)
{
	unsigned char recvbuf[MAX_NB_BYTES_RPLIDAR];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	unsigned char* ptr = NULL;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_RPLIDAR-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired data response...

	nbBytesToRequest = nb_bytes_response;
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a RPLIDAR. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += nbBytesToRequest;

	for (;;)
	{
		res = FindExpressScanDataResponseRPLIDAR(recvbuf, BytesReceived, nb_bytes_response, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(nb_bytes_response, nbBytesDiscarded);
		}
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a RPLIDAR : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a RPLIDAR. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_RPLIDAR)
		{
			printf("Error reading data from a RPLIDAR : Data response timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-nb_bytes_response > 0)
	{
		printf("Warning getting data from a RPLIDAR : Unexpected data after a data response. \n");
	}

	// Store the data...
	memcpy(esdataresponse, recvbuf, nb_bytes_response);

	return EXIT_SUCCESS;
}